

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::GraphicsRobustAccessPass::GetGlslInsts(GraphicsRobustAccessPass *this)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  Instruction *this_00;
  Operand *this_01;
  Module *this_02;
  Operand *local_158;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_140
  ;
  pointer local_138;
  Instruction *inst_1;
  Operand local_108;
  undefined1 local_d8 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_b8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  import_inst;
  string local_a8;
  undefined1 local_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  Instruction *inst;
  iterator __end3;
  iterator __begin3;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range3;
  char cStack_18;
  char cStack_17;
  char cStack_16;
  char glsl [13];
  GraphicsRobustAccessPass *this_local;
  
  if (*(int *)&this->field_0x38 == 0) {
    __range3._3_1_ = 'G';
    __range3._4_1_ = 'L';
    __range3._5_1_ = 'S';
    __range3._6_1_ = 'L';
    __range3._7_1_ = '.';
    cStack_18 = 's';
    cStack_17 = 't';
    cStack_16 = 'd';
    builtin_strncpy(glsl,".450",5);
    glsl._5_8_ = this;
    pIVar3 = Pass::context(&this->super_Pass);
    IRContext::module(pIVar3);
    Module::ext_inst_imports((Module *)&__begin3);
    IteratorRange<spvtools::opt::InstructionList::iterator>::begin
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end3);
    IteratorRange<spvtools::opt::InstructionList::iterator>::end
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
    while (bVar1 = utils::operator!=(&__end3.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&inst), bVar1)
    {
      this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
      this_01 = opt::Instruction::GetInOperand(this_00,0);
      Operand::AsString_abi_cxx11_
                ((string *)
                 &words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,this_01);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (char *)((long)&__range3 + 3));
      std::__cxx11::string::~string
                ((string *)
                 &words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        uVar2 = opt::Instruction::result_id(this_00);
        *(uint32_t *)&this->field_0x38 = uVar2;
      }
      InstructionList::iterator::operator++(&__end3);
    }
    if (*(int *)&this->field_0x38 == 0) {
      uVar2 = Pass::TakeNextId(&this->super_Pass);
      *(uint32_t *)&this->field_0x38 = uVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,(char *)((long)&__range3 + 3),
                 (allocator<char> *)
                 ((long)&import_inst._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                 7));
      utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&import_inst._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                 7));
      local_d8._24_8_ = Pass::context(&this->super_Pass);
      local_d8._20_4_ = 0xb;
      local_d8._16_4_ = 0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)&inst_1,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      Operand::Operand(&local_108,SPV_OPERAND_TYPE_LITERAL_STRING,(OperandData *)&inst_1);
      local_d8._0_8_ = &local_108;
      local_d8._8_8_ = (_func_int **)0x1;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)&local_b8,(IRContext **)(local_d8 + 0x18),(Op *)(local_d8 + 0x14),
                 (int *)(local_d8 + 0x10),(uint *)&this->field_0x38,
                 (initializer_list<spvtools::opt::Operand> *)local_d8);
      local_158 = (Operand *)local_d8;
      do {
        local_158 = local_158 + -1;
        Operand::~Operand(local_158);
      } while (local_158 != &local_108);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&inst_1)
      ;
      local_138 = std::
                  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ::get(&local_b8);
      pIVar3 = Pass::context(&this->super_Pass);
      this_02 = IRContext::module(pIVar3);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::unique_ptr(&local_140,&local_b8);
      Module::AddExtInstImport(this_02,&local_140);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_140);
      (this->super_Pass).field_0x34 = 1;
      pIVar3 = Pass::context(&this->super_Pass);
      IRContext::AnalyzeDefUse(pIVar3,local_138);
      pIVar3 = Pass::context(&this->super_Pass);
      IRContext::ResetFeatureManager(pIVar3);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_b8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
    }
  }
  return *(uint32_t *)&this->field_0x38;
}

Assistant:

uint32_t GraphicsRobustAccessPass::GetGlslInsts() {
  if (module_status_.glsl_insts_id == 0) {
    // This string serves double-duty as raw data for a string and for a vector
    // of 32-bit words
    const char glsl[] = "GLSL.std.450";
    // Use an existing import if we can.
    for (auto& inst : context()->module()->ext_inst_imports()) {
      if (inst.GetInOperand(0).AsString() == glsl) {
        module_status_.glsl_insts_id = inst.result_id();
      }
    }
    if (module_status_.glsl_insts_id == 0) {
      // Make a new import instruction.
      module_status_.glsl_insts_id = TakeNextId();
      std::vector<uint32_t> words = spvtools::utils::MakeVector(glsl);
      auto import_inst = MakeUnique<Instruction>(
          context(), spv::Op::OpExtInstImport, 0, module_status_.glsl_insts_id,
          std::initializer_list<Operand>{
              Operand{SPV_OPERAND_TYPE_LITERAL_STRING, std::move(words)}});
      Instruction* inst = import_inst.get();
      context()->module()->AddExtInstImport(std::move(import_inst));
      module_status_.modified = true;
      context()->AnalyzeDefUse(inst);
      // Invalidates the feature manager, since we added an extended instruction
      // set import.
      context()->ResetFeatureManager();
    }
  }
  return module_status_.glsl_insts_id;
}